

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

void conf_set_filename(Conf *conf,int primary,Filename *value)

{
  conf_entry *entry_00;
  Filename *pFVar1;
  conf_entry *entry;
  Filename *value_local;
  int primary_local;
  Conf *conf_local;
  
  entry_00 = (conf_entry *)safemalloc(1,0x18,0);
  if (subkeytypes[primary] != 0) {
    __assert_fail("subkeytypes[primary] == TYPE_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x1e5,"void conf_set_filename(Conf *, int, const Filename *)");
  }
  if (valuetypes[primary] == 4) {
    (entry_00->key).primary = primary;
    pFVar1 = filename_copy(value);
    (entry_00->value).u.fileval = pFVar1;
    conf_insert(conf,entry_00);
    return;
  }
  __assert_fail("valuetypes[primary] == TYPE_FILENAME",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x1e6,"void conf_set_filename(Conf *, int, const Filename *)");
}

Assistant:

void conf_set_filename(Conf *conf, int primary, const Filename *value)
{
    struct conf_entry *entry = snew(struct conf_entry);

    assert(subkeytypes[primary] == TYPE_NONE);
    assert(valuetypes[primary] == TYPE_FILENAME);
    entry->key.primary = primary;
    entry->value.u.fileval = filename_copy(value);
    conf_insert(conf, entry);
}